

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::delete_node
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          AlexNode<int,_int> *node)

{
  long in_RSI;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffffa8;
  new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
  *in_stack_ffffffffffffffb0;
  new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *this_00;
  new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> local_25 [37]
  ;
  
  if (in_RSI != 0) {
    if ((*(byte *)(in_RSI + 8) & 1) == 0) {
      this_00 = local_25;
      model_node_allocator
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                 in_stack_ffffffffffffffa8);
      __gnu_cxx::new_allocator<alex::AlexModelNode<int,int,std::allocator<std::pair<int,int>>>>::
      destroy<alex::AlexModelNode<int,int,std::allocator<std::pair<int,int>>>>
                (this_00,(AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_ffffffffffffffa8);
      std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *
                 )0x13bad4);
      model_node_allocator
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                 in_stack_ffffffffffffffa8);
      __gnu_cxx::
      new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      deallocate(this_00,(AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_ffffffffffffffa8,0x13bafc);
      std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *
                 )0x13bb08);
    }
    else {
      data_node_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                           *)in_stack_ffffffffffffffa8);
      __gnu_cxx::
      new_allocator<alex::AlexDataNode<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>>
      ::
      destroy<alex::AlexDataNode<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::
      allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
      ::~allocator((allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                    *)0x13ba51);
      data_node_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                           *)in_stack_ffffffffffffffa8);
      __gnu_cxx::
      new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
      ::deallocate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x13ba79);
      std::
      allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
      ::~allocator((allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                    *)0x13ba85);
    }
  }
  return;
}

Assistant:

void delete_node(AlexNode<T, P>* node) {
    if (node == nullptr) {
      return;
    } else if (node->is_leaf_) {
      data_node_allocator().destroy(static_cast<data_node_type*>(node));
      data_node_allocator().deallocate(static_cast<data_node_type*>(node), 1);
    } else {
      model_node_allocator().destroy(static_cast<model_node_type*>(node));
      model_node_allocator().deallocate(static_cast<model_node_type*>(node), 1);
    }
  }